

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dictionary.h
# Opt level: O3

bool __thiscall
JsUtil::
WeaklyReferencedKeyDictionary<Js::DynamicType,_Js::DynamicType_*,_DefaultComparer<const_Js::DynamicType_*>,_true>
::TryGetValue(WeaklyReferencedKeyDictionary<Js::DynamicType,_Js::DynamicType_*,_DefaultComparer<const_Js::DynamicType_*>,_true>
              *this,DynamicType *key,DynamicType **value)

{
  WeakRefDictionaryEntry<Js::DynamicType,_Memory::WriteBarrierPtr<Js::DynamicType>_> *pWVar1;
  DynamicType *pDVar2;
  hash_t bucket;
  uint uVar3;
  uint previous;
  uint i;
  uint key_00;
  
  if ((this->buckets).ptr == (int *)0x0) {
    return false;
  }
  key_00 = (uint)((ulong)key >> 3) | 1;
  bucket = PrimePolicy::ModPrime(key_00,this->size,this->modFunctionIndex);
  if ((this->buckets).ptr != (int *)0x0) {
    Memory::Recycler::IsSweeping(this->recycler);
    i = (this->buckets).ptr[bucket];
    if (-1 < (int)i) {
      previous = 0xffffffff;
      do {
        pWVar1 = (this->entries).ptr;
        if (pWVar1[i].hash == key_00) {
          pDVar2 = (DynamicType *)((pWVar1[i].key.ptr)->super_RecyclerWeakReferenceBase).strongRef;
          if (pDVar2 != (DynamicType *)0x0) {
            if (pDVar2 == key) {
              *value = pWVar1[i].value.ptr;
              return true;
            }
            goto LAB_00dc89d8;
          }
          uVar3 = RemoveEntry(this,i,previous,bucket);
        }
        else {
LAB_00dc89d8:
          uVar3 = pWVar1[i].next;
          previous = i;
        }
        i = uVar3;
      } while (-1 < (int)i);
    }
  }
  return false;
}

Assistant:

inline int FindEntry(const TLookup* key)
        {
            if (buckets != nullptr)
            {
                hash_t hash = GetHashCode(key);
                uint bucket = PrimePolicy::GetBucket(hash, size, modFunctionIndex);
                int previous = -1;
                return FindEntry(key, hash, bucket, previous);
            }

            return -1;
        }